

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void __thiscall
duckdb::RLEState<unsigned_long>::Update<duckdb::EmptyRLEWriter>
          (RLEState<unsigned_long> *this,unsigned_long *data,ValidityMask *validity,idx_t idx)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  long in_RCX;
  long in_RSI;
  TemplatedValidityMask<unsigned_long> *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (in_RDI,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    if (((ulong)in_RDI[1].validity_mask & 1) == 0) {
      if ((in_RDI->validity_data).internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == *(element_type **)(in_RSI + in_RCX * 8)) {
        *(short *)&(in_RDI->validity_data).internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi =
             *(short *)&(in_RDI->validity_data).internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + 1;
      }
      else {
        if (*(short *)&(in_RDI->validity_data).internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi != 0) {
          Flush<duckdb::EmptyRLEWriter>((RLEState<unsigned_long> *)0xa63adc);
          in_RDI->validity_mask = (unsigned_long *)((long)in_RDI->validity_mask + 1);
        }
        (in_RDI->validity_data).internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = *(element_type **)(in_RSI + in_RCX * 8);
        *(undefined2 *)
         &(in_RDI->validity_data).internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = 1;
      }
    }
    else {
      (in_RDI->validity_data).internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = *(element_type **)(in_RSI + in_RCX * 8);
      in_RDI->validity_mask = (unsigned_long *)((long)in_RDI->validity_mask + 1);
      *(short *)&(in_RDI->validity_data).internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi =
           *(short *)&(in_RDI->validity_data).internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi + 1;
      *(undefined1 *)&in_RDI[1].validity_mask = 0;
    }
  }
  else {
    *(short *)&(in_RDI->validity_data).internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi =
         *(short *)&(in_RDI->validity_data).internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 1;
  }
  uVar3 = (uint)*(ushort *)
                 &(in_RDI->validity_data).internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
  uVar2 = NumericLimits<unsigned_short>::Maximum();
  if (uVar3 == uVar2) {
    Flush<duckdb::EmptyRLEWriter>((RLEState<unsigned_long> *)0xa63b47);
    *(undefined2 *)
     &(in_RDI->validity_data).internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = 0;
    in_RDI->validity_mask = (unsigned_long *)((long)in_RDI->validity_mask + 1);
  }
  return;
}

Assistant:

void Update(const T *data, ValidityMask &validity, idx_t idx) {
		if (validity.RowIsValid(idx)) {
			if (all_null) {
				// no value seen yet
				// assign the current value, and increment the seen_count
				// note that we increment last_seen_count rather than setting it to 1
				// this is intentional: this is the first VALID value we see
				// but it might not be the first value in case of nulls!
				last_value = data[idx];
				seen_count++;
				last_seen_count++;
				all_null = false;
			} else if (last_value == data[idx]) {
				// the last value is identical to this value: increment the last_seen_count
				last_seen_count++;
			} else {
				// the values are different
				// issue the callback on the last value
				// edge case: if a value has exactly 2^16 repeated values, we can end up here with last_seen_count = 0
				if (last_seen_count > 0) {
					Flush<OP>();
					seen_count++;
				}

				// increment the seen_count and put the new value into the RLE slot
				last_value = data[idx];
				last_seen_count = 1;
			}
		} else {
			// NULL value: we merely increment the last_seen_count
			last_seen_count++;
		}
		if (last_seen_count == NumericLimits<rle_count_t>::Maximum()) {
			// we have seen the same value so many times in a row we are at the limit of what fits in our count
			// write away the value and move to the next value
			Flush<OP>();
			last_seen_count = 0;
			seen_count++;
		}
	}